

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NormalMap.cpp
# Opt level: O3

FloatImage * nv::createNormalMap(Image *img,WrapMode wm,Arg heightWeights,Arg filterWeights)

{
  int iVar1;
  Kernel2 *this;
  Kernel2 *this_00;
  FloatImage *pFVar2;
  
  if (img == (Image *)0x0) {
    iVar1 = nvAbort("img != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/NormalMap.cpp"
                    ,0x76,
                    "FloatImage *nv::createNormalMap(const Image *, FloatImage::WrapMode, Vector4::Arg, Vector4::Arg)"
                   );
    if (iVar1 == 1) {
      raise(5);
    }
  }
  this = (Kernel2 *)operator_new(0x10);
  Kernel2::Kernel2(this,9);
  Kernel2::initBlendedSobel(this,filterWeights);
  Kernel2::normalize(this);
  this_00 = (Kernel2 *)operator_new(0x10);
  Kernel2::Kernel2(this_00,this);
  Kernel2::transpose(this_00);
  pFVar2 = ::createNormalMap(img,wm,heightWeights,this,this_00);
  return pFVar2;
}

Assistant:

FloatImage * nv::createNormalMap(const Image * img, FloatImage::WrapMode wm, Vector4::Arg heightWeights, Vector4::Arg filterWeights)
{
	nvCheck(img != NULL);

	Kernel2 * kdu = NULL;
	Kernel2 * kdv = NULL;

	kdu = new Kernel2(9);
	kdu->initBlendedSobel(filterWeights);
	kdu->normalize();
	
	kdv = new Kernel2(*kdu);
	kdv->transpose();
	
	return ::createNormalMap(img, wm, heightWeights, kdu, kdv);
}